

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

IndexPair __thiscall
slang::IntervalMap<int,int,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<int,int,16u,true>,slang::IntervalMapDetails::LeafNode<int,int,16u,false>,true>
          (IntervalMap<int,int,0u> *this,LeafNode<int,_int,_16U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  LeafNode<int,_int,_16U,_false> *pLVar4;
  ulong *puVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  undefined4 *puVar9;
  long lVar10;
  uint *puVar11;
  int iVar12;
  bool bVar13;
  uint32_t sizes [2];
  uint32_t local_58;
  uint local_54;
  ulong local_50 [2];
  IndexPair local_40;
  allocator_type *local_38;
  
  puVar11 = &local_58;
  puVar7 = &local_58;
  local_38 = alloc;
  local_40 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),0x10,&local_58,position);
  iVar12 = 0;
  puVar5 = local_50 + 1;
  local_50[1] = 0;
  local_50[0] = 0;
  bVar3 = true;
  do {
    bVar13 = bVar3;
    pLVar4 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)local_38);
    uVar1 = *puVar11;
    if (uVar1 != 0) {
      lVar6 = 0;
      do {
        uVar8 = iVar12 + (int)lVar6;
        (pLVar4->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).first[lVar6] =
             (rootNode->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).first
             [uVar8];
        (pLVar4->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).second[lVar6] =
             (rootNode->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).second
             [uVar8];
        lVar6 = lVar6 + 1;
      } while (uVar1 != (uint)lVar6);
    }
    iVar12 = iVar12 + uVar1;
    *puVar5 = (ulong)pLVar4 & 0xffffffffffffffc0 | (ulong)(uVar1 - 1);
    puVar5 = local_50;
    puVar11 = &local_54;
    bVar3 = false;
  } while (bVar13);
  lVar6 = 0;
  memset(this,0,0xc0);
  puVar5 = local_50 + 1;
  bVar3 = true;
  do {
    bVar13 = bVar3;
    uVar2 = *puVar5;
    puVar9 = (undefined4 *)(uVar2 & 0xffffffffffffffc0);
    iVar12 = puVar9[1];
    if (1 < (ulong)*puVar7) {
      lVar10 = 0;
      do {
        if (iVar12 <= (int)puVar9[lVar10 * 2 + 3]) {
          iVar12 = puVar9[lVar10 * 2 + 3];
        }
        lVar10 = lVar10 + 1;
      } while ((ulong)*puVar7 - 1 != lVar10);
    }
    *(ulong *)(this + lVar6 * 8 + 0x60) = CONCAT44(iVar12,*puVar9);
    *(ulong *)(this + lVar6 * 8) = uVar2;
    lVar6 = 1;
    puVar7 = &local_54;
    puVar5 = local_50;
    bVar3 = false;
  } while (bVar13);
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return local_40;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}